

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int monteCarloBiomes(Generator *g,Range r,uint64_t *rng,double coverage,double confidence,
                    _func_int_Generator_ptr_int_int_int_int_void_ptr *eval,void *data)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined8 in_RCX;
  undefined8 *puVar5;
  code *in_RDX;
  undefined8 in_RDI;
  int iVar6;
  double in_XMM0_Qa;
  double dVar7;
  double dVar8;
  undefined4 uVar11;
  double dVar9;
  undefined1 auVar12 [16];
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_00000020;
  double hi;
  double lo;
  double per_m;
  int status;
  int k_1;
  int j_1;
  touple t;
  int ret;
  double x;
  double m;
  size_t i;
  int j;
  int k;
  int i_1;
  size_t idx;
  double whi;
  double wlo;
  double wn;
  double zscore;
  size_t n;
  touple *buf;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int n_00;
  uint64_t *seed;
  double *hi_00;
  double *in_stack_ffffffffffffff28;
  undefined4 *z;
  double in_stack_ffffffffffffff38;
  double in_stack_ffffffffffffff40;
  undefined8 local_a0;
  int local_98;
  uint local_94;
  double local_90;
  double local_88;
  ulong local_80;
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  double local_60;
  double local_58;
  void *local_38;
  undefined1 auVar10 [16];
  
  z = (undefined4 *)&stack0x00000008;
  local_38 = (void *)0x0;
  uVar3 = (long)in_stack_00000014 * (long)in_stack_00000020 * (long)in_stack_00000018;
  dVar7 = sqrt(2.0);
  dVar8 = inverf((double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  n_00 = 0;
  uVar11 = (undefined4)(uVar3 >> 0x20);
  auVar10._8_4_ = uVar11;
  auVar10._0_8_ = uVar3;
  auVar10._12_4_ = 0x45300000;
  iVar6 = (int)uVar3;
  seed = (uint64_t *)0x4330000000000000;
  hi_00 = (double *)0x4530000000000000;
  dVar9 = sqrt((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0));
  wilson(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(double)z,in_stack_ffffffffffffff28,
         hi_00);
  auVar12._8_4_ = uVar11;
  auVar12._0_8_ = uVar3;
  auVar12._12_4_ = 0x45300000;
  if (((auVar12._8_8_ - (double)hi_00) + ((double)CONCAT44(0x43300000,iVar6) - (double)seed) <
       dVar7 * dVar8 * dVar9 * 4.0) && (uVar3 < 0x7fffffff)) {
    local_38 = malloc(uVar3 * 0xc);
  }
  if (local_38 != (void *)0x0) {
    local_68 = 0;
    for (local_70 = 0; local_70 < (int)z[6]; local_70 = local_70 + 1) {
      for (local_74 = 0; local_74 < (int)z[4]; local_74 = local_74 + 1) {
        for (local_6c = 0; local_6c < (int)z[3]; local_6c = local_6c + 1) {
          *(int *)((long)local_38 + local_68 * 0xc) = local_6c;
          *(int *)((long)local_38 + local_68 * 0xc + 4) = local_70;
          *(int *)((long)local_38 + local_68 * 0xc + 8) = local_74;
          local_68 = local_68 + 1;
        }
      }
    }
  }
  local_88 = 0.0;
  local_90 = 0.0;
  local_94 = 1;
  local_80 = 0;
  do {
    if (uVar3 <= local_80) {
LAB_00110cac:
      if (local_38 != (void *)0x0) {
        free(local_38);
      }
      return local_94;
    }
    if (local_38 == (void *)0x0) {
      iVar1 = nextInt(seed,n_00);
      iVar2 = nextInt(seed,n_00);
      local_a0 = CONCAT44(iVar2,iVar1);
      local_98 = nextInt(seed,n_00);
    }
    else {
      iVar1 = iVar6 - (int)local_80;
      iVar2 = nextInt(seed,n_00);
      puVar4 = (undefined8 *)((long)local_38 + (long)iVar2 * 0xc);
      local_a0 = *puVar4;
      local_98 = *(int *)(puVar4 + 1);
      if (iVar2 != iVar1 + -1) {
        puVar4 = (undefined8 *)((long)local_38 + (long)iVar2 * 0xc);
        puVar5 = (undefined8 *)((long)local_38 + (long)(iVar1 + -1) * 0xc);
        *puVar4 = *puVar5;
        *(undefined4 *)(puVar4 + 1) = *(undefined4 *)(puVar5 + 1);
        puVar4 = (undefined8 *)((long)local_38 + (long)(iVar1 + -1) * 0xc);
        *puVar4 = local_a0;
        *(int *)(puVar4 + 1) = local_98;
      }
    }
    iVar1 = (*in_RDX)(in_RDI,*z,z[1] + (int)local_a0,z[5] + local_a0._4_4_,z[2] + local_98,in_RCX);
    if (iVar1 != -1) {
      if (iVar1 != 0) {
        if (iVar1 != 1) {
          local_94 = 0;
          goto LAB_00110cac;
        }
        local_90 = local_90 + 1.0;
      }
      local_88 = local_88 + 1.0;
      dVar7 = 1.0 / local_88;
      wilson(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(double)z,in_stack_ffffffffffffff28
             ,hi_00);
      if (in_XMM0_Qa < in_stack_ffffffffffffff40 - dVar7) {
        local_94 = 1;
        goto LAB_00110cac;
      }
      if (in_stack_ffffffffffffff38 + dVar7 < in_XMM0_Qa) {
        local_94 = 0;
        goto LAB_00110cac;
      }
      if (in_stack_ffffffffffffff38 - in_stack_ffffffffffffff40 < local_60 - local_58) {
        local_94 = (uint)(in_XMM0_Qa < local_90 * dVar7);
        goto LAB_00110cac;
      }
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

int monteCarloBiomes(
        Generator         * g,
        Range               r,
        uint64_t          * rng,
        double              coverage,
        double              confidence,
        int (*eval)(Generator *g, int scale, int x, int y, int z, void*),
        void              * data
        )
{
    if (r.sy == 0)
        r.sy = 1;

    struct touple { int x, y, z; } *buf = 0;
    size_t n = (size_t)r.sx*r.sy*r.sz;

    // z-score (i.e. probit, or standard deviations) for the confidence
    double zscore = sqrt(2.0) * inverf(confidence);

    // One standard deviation is approximately given by sqrt(n) elements,
    // hence we will take zscore * sqrt(n) as the maximum number of samples
    // to reach the desired confidence. This gives us a wilson score interval
    // for the upper and lower bound of successes we aim for.
    double wn = zscore * sqrt(n);
    double wlo, whi;
    wilson(wn, coverage, zscore, &wlo, &whi);

    // When the number of samples approaches the total number elements,
    // we can avoid repeated samples by shuffling a buffer.
    // (TODO: adjust for hypergeometric distribution?)
    if (n < 4 * wn && n < INT_MAX)
        buf = (struct touple*) malloc(n * sizeof(*buf));

    if (buf)
    {
        size_t idx = 0;
        int i, k, j;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    buf[idx].x = i;
                    buf[idx].y = k;
                    buf[idx].z = j;
                    idx++;
                }
            }
        }
    }

    size_t i = 0;
    double m = 0; // number of samples
    double x = 0; // number of successes
    int ret = 1;

    // iterate over the area in a random order
    for (i = 0; i < n; i++)
    {
        struct touple t;
        if (buf)
        {
            int j = n - i;
            int k = nextInt(rng, j);
            t = buf[k];
            if (k != j-1)
            {
                buf[k] = buf[j-1];
                buf[j-1] = t;
            }
        }
        else
        {
            t.x = nextInt(rng, r.sx);
            t.y = nextInt(rng, r.sy);
            t.z = nextInt(rng, r.sz);
        }

        int status = eval(g, r.scale, r.x+t.x, r.y+t.y, r.z+t.z, data);
        if (status == -1)
            continue;
        else if (status == 0)
            ;
        else if (status == 1)
            x += 1.0;
        else
        {
            ret = 0;
            break;
        }
        m += 1.0;

        // check if we can abort early with the current confidence interval
        double per_m = 1.0 / m;
        double lo, hi;
        wilson(m, x * per_m, zscore, &lo, &hi);

        if (lo - per_m > coverage)
        {
            ret = 1;
            break;
        }
        if (hi + per_m < coverage)
        {
            ret = 0;
            break;
        }

        if (hi - lo < whi - wlo)
        {   // should occur around i ~ wn
            ret = x * per_m > coverage;
            break;
        }
    }
    if (buf)
        free(buf);
    return ret;
}